

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

size_t powerpc_Convert(_7zip_conflict *zip,uint8_t *buf,size_t size)

{
  int iVar1;
  uint32_t dest;
  uint32_t src;
  size_t i;
  size_t size_local;
  uint8_t *buf_local;
  _7zip_conflict *zip_local;
  
  for (_dest = 0; _dest < (size & 0xfffffffffffffffc); _dest = _dest + 4) {
    if (((int)(uint)buf[_dest] >> 2 == 0x12) && ((buf[_dest + 3] & 3) == 1)) {
      iVar1 = ((buf[_dest] & 3) << 0x18 | (uint)buf[_dest + 1] << 0x10 | (uint)buf[_dest + 2] << 8 |
              buf[_dest + 3] & 0xfffffffc) - (zip->bcj_ip + (int)_dest);
      buf[_dest] = (byte)((uint)iVar1 >> 0x18) & 3 | 0x48;
      buf[_dest + 1] = (uint8_t)((uint)iVar1 >> 0x10);
      buf[_dest + 2] = (uint8_t)((uint)iVar1 >> 8);
      buf[_dest + 3] = buf[_dest + 3] & 3;
      buf[_dest + 3] = buf[_dest + 3] | (byte)iVar1;
    }
  }
  zip->bcj_ip = (int)_dest + zip->bcj_ip;
  return _dest;
}

Assistant:

static size_t
powerpc_Convert(struct _7zip *zip, uint8_t *buf, size_t size)
{
	// This function was adapted from
	// static size_t powerpc_code(void *simple, uint32_t now_pos, bool is_encoder, uint8_t *buffer, size_t size)
	// in https://git.tukaani.org/xz.git

	/*
	 * Filter for PowerPC (big endian) binaries
	 *
	 * Authors: Igor Pavlov
	 *          Lasse Collin
	 *
	 * Copyright (C) The XZ Utils authors and contributors
	 *
	 * Permission to use, copy, modify, and/or distribute this
	 * software for any purpose with or without fee is hereby granted.
	 *
	 * THE SOFTWARE IS PROVIDED "AS IS" AND THE AUTHOR DISCLAIMS ALL
	 * WARRANTIES WITH REGARD TO THIS SOFTWARE INCLUDING ALL IMPLIED
	 * WARRANTIES OF MERCHANTABILITY AND FITNESS. IN NO EVENT SHALL
	 * THE AUTHOR BE LIABLE FOR ANY SPECIAL, DIRECT, INDIRECT, OR
	 * CONSEQUENTIAL DAMAGES OR ANY DAMAGES WHATSOEVER RESULTING FROM
	 * LOSS OF USE, DATA OR PROFITS, WHETHER IN AN ACTION OF CONTRACT,
	 * NEGLIGENCE OR OTHER TORTIOUS ACTION, ARISING OUT OF OR IN
	 * CONNECTION WITH THE USE OR PERFORMANCE OF THIS SOFTWARE.
	 */

	size &= ~(size_t)3;

	size_t i;
	for (i = 0; i < size; i += 4) {
		// PowerPC branch 6(48) 24(Offset) 1(Abs) 1(Link)
		if ((buf[i] >> 2) == 0x12
			&& ((buf[i + 3] & 3) == 1)) {

			const uint32_t src
				= (((uint32_t)(buf[i + 0]) & 3) << 24)
				| ((uint32_t)(buf[i + 1]) << 16)
				| ((uint32_t)(buf[i + 2]) << 8)
				| ((uint32_t)(buf[i + 3]) & ~UINT32_C(3));

			uint32_t dest = src - (zip->bcj_ip + (uint32_t)(i));

			buf[i + 0] = 0x48 | ((dest >> 24) &  0x03);
			buf[i + 1] = (dest >> 16);
			buf[i + 2] = (dest >> 8);
			buf[i + 3] &= 0x03;
			buf[i + 3] |= dest;
		}
	}

	zip->bcj_ip += (uint32_t)i;

	return i;
}